

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O1

string * configDir_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  string userDir;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  pcVar1 = getenv("HOME");
  std::__cxx11::string::string((string *)&local_38,pcVar1,&local_59);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_38,local_38 + local_30);
  path<std::__cxx11::string,char_const*>(in_RDI,&local_58,".sshba");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return in_RDI;
}

Assistant:

std::string configDir() {
    std::string userDir = getUserDir();
    return path(userDir, ".sshba");
}